

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  bool bVar1;
  size_t sVar2;
  char *d;
  Slice local_38;
  uint local_24;
  Slice *pSStack_20;
  uint32_t len;
  Slice *result_local;
  Slice *input_local;
  
  pSStack_20 = result;
  result_local = input;
  bVar1 = GetVarint32(input,&local_24);
  if ((bVar1) && (sVar2 = Slice::size(result_local), local_24 <= sVar2)) {
    d = Slice::data(result_local);
    Slice::Slice(&local_38,d,(ulong)local_24);
    pSStack_20->data_ = local_38.data_;
    pSStack_20->size_ = local_38.size_;
    Slice::remove_prefix(result_local,(ulong)local_24);
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}